

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_inter_pred_chroma_vert_w16inp_ssse3
               (WORD16 *pi2_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined4 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 uVar40;
  ulong *puVar41;
  int in_ECX;
  int in_EDX;
  ulong *in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  int in_R9D;
  int iVar42;
  int iVar48;
  ulong uVar43;
  int iVar49;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar50;
  __m128i s22_8x16b;
  __m128i s21_8x16b;
  __m128i sign_reg;
  __m128i mask_high_96b;
  __m128i mask_low_32b;
  __m128i offset_8x16b;
  __m128i zero_8x16b;
  __m128i s16_8x16b;
  __m128i s15_8x16b;
  __m128i s12_8x16b;
  __m128i s11_8x16b;
  __m128i s9_8x16b;
  __m128i s8_8x16b;
  __m128i s7_8x16b;
  __m128i s6_8x16b;
  __m128i s5_8x16b;
  __m128i s4_8x16b;
  __m128i coeff2_3_8x16b;
  __m128i coeff0_1_8x16b;
  UWORD8 *pu1_dst_copy;
  WORD16 *pi2_src_copy;
  WORD32 col;
  WORD32 row;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined1 uStack_cb6;
  undefined1 uStack_cb5;
  undefined1 uStack_cb4;
  undefined1 uStack_cb3;
  undefined1 uStack_cb2;
  undefined1 uStack_cb1;
  undefined1 uStack_cae;
  undefined1 uStack_cad;
  undefined1 uStack_cac;
  undefined1 uStack_cab;
  undefined1 uStack_caa;
  undefined1 uStack_ca9;
  undefined8 local_ba8;
  undefined1 uStack_b84;
  undefined1 uStack_b83;
  undefined1 uStack_b82;
  undefined1 uStack_b81;
  undefined1 uStack_b7c;
  undefined1 uStack_b7b;
  undefined1 uStack_b7a;
  undefined1 uStack_b79;
  undefined8 uStack_b70;
  undefined4 uStack_b64;
  undefined8 uStack_b60;
  int local_b14;
  int local_b10;
  ulong *local_af8;
  undefined8 *local_af0;
  short local_938;
  short sStack_936;
  short sStack_934;
  short sStack_932;
  short local_918;
  short sStack_916;
  short sStack_914;
  short sStack_912;
  short local_8f8;
  short sStack_8f6;
  short sStack_8f4;
  short sStack_8f2;
  short local_8d8;
  short sStack_8d6;
  short sStack_8d4;
  short sStack_8d2;
  short local_8b8;
  short sStack_8b6;
  short sStack_8b4;
  short sStack_8b2;
  short local_898;
  short sStack_896;
  short sStack_894;
  short sStack_892;
  undefined1 uStack_7f4;
  undefined1 uStack_7f3;
  undefined1 uStack_7f2;
  undefined1 uStack_7f1;
  char local_758;
  char cStack_757;
  char cStack_756;
  char cStack_755;
  undefined2 local_738;
  undefined2 uStack_736;
  undefined2 uStack_734;
  undefined2 uStack_732;
  undefined2 local_6f8;
  undefined2 uStack_6f6;
  undefined2 uStack_6f4;
  undefined2 uStack_6f2;
  undefined2 uStack_6e6;
  undefined2 uStack_6e4;
  undefined2 uStack_6e2;
  undefined2 local_6d8;
  undefined2 uStack_6d6;
  undefined2 uStack_6d4;
  undefined2 uStack_6d2;
  undefined2 uStack_6c6;
  undefined2 uStack_6c4;
  undefined2 uStack_6c2;
  undefined2 local_6b8;
  undefined2 uStack_6b6;
  undefined2 uStack_6b4;
  undefined2 uStack_6b2;
  undefined2 local_678;
  undefined2 uStack_676;
  undefined2 uStack_674;
  undefined2 uStack_672;
  undefined2 uStack_666;
  undefined2 uStack_664;
  undefined2 uStack_662;
  undefined2 local_658;
  undefined2 uStack_656;
  undefined2 uStack_654;
  undefined2 uStack_652;
  undefined2 uStack_646;
  undefined2 uStack_644;
  undefined2 uStack_642;
  int local_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  int local_488;
  int iStack_484;
  int iStack_480;
  int iStack_47c;
  int local_458;
  int iStack_454;
  int iStack_450;
  int iStack_44c;
  int local_448;
  int iStack_444;
  int iStack_440;
  int iStack_43c;
  int local_3f8;
  int iStack_3f4;
  int iStack_3f0;
  int iStack_3ec;
  int local_3e8;
  int iStack_3e4;
  int iStack_3e0;
  int iStack_3dc;
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  int local_3c8;
  int iStack_3c4;
  int iStack_3c0;
  int iStack_3bc;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_368;
  int iStack_364;
  int iStack_360;
  int iStack_35c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_348;
  int iStack_344;
  int iStack_340;
  int iStack_33c;
  int iStack_324;
  int iStack_31c;
  int iStack_2e4;
  int iStack_2dc;
  int iStack_2a4;
  int iStack_29c;
  int iStack_284;
  int iStack_27c;
  int iStack_224;
  int iStack_21c;
  int iStack_204;
  int iStack_1fc;
  __m128i s35_8x16b;
  __m128i s34_8x16b;
  __m128i s33_8x16b;
  __m128i s32_8x16b;
  __m128i s31_8x16b;
  __m128i s25_8x16b;
  __m128i s24_8x16b;
  __m128i s23_8x16b;
  
  uVar2 = *in_R8;
  local_758 = (char)uVar2;
  cStack_757 = (char)((ulong)uVar2 >> 8);
  cStack_756 = (char)((ulong)uVar2 >> 0x10);
  cStack_755 = (char)((ulong)uVar2 >> 0x18);
  uVar36 = CONCAT13(-(cStack_757 < '\0'),
                    CONCAT12(cStack_757,CONCAT11(-(local_758 < '\0'),local_758)));
  uStack_b64 = (undefined4)
               (CONCAT17(-(cStack_755 < '\0'),
                         CONCAT16(cStack_755,
                                  CONCAT15(-(cStack_756 < '\0'),CONCAT14(cStack_756,uVar36)))) >>
               0x20);
  if ((int)s22_8x16b[1] % 4 == 0) {
    for (local_b14 = 0;
        SBORROW4(local_b14,(int)s22_8x16b[1] * 2) != local_b14 + (int)s22_8x16b[1] * -2 < 0;
        local_b14 = local_b14 + 8) {
      local_af0 = (undefined8 *)((long)in_RDI + (long)local_b14 * 2);
      local_af8 = (ulong *)((long)in_RSI + (long)local_b14);
      for (local_b10 = 0; local_b10 < in_R9D; local_b10 = local_b10 + 2) {
        puVar1 = (undefined8 *)((long)local_af0 + (long)-in_EDX * 2);
        uVar2 = *puVar1;
        uVar3 = puVar1[1];
        uVar4 = *local_af0;
        uVar5 = local_af0[1];
        puVar1 = (undefined8 *)((long)local_af0 + (long)in_EDX * 2);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)((long)local_af0 + (long)(in_EDX * 2) * 2);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        uStack_646 = (undefined2)((ulong)uVar2 >> 0x10);
        uStack_644 = (undefined2)((ulong)uVar2 >> 0x20);
        uStack_642 = (undefined2)((ulong)uVar2 >> 0x30);
        local_658 = (undefined2)uVar4;
        uStack_656 = (undefined2)((ulong)uVar4 >> 0x10);
        uStack_654 = (undefined2)((ulong)uVar4 >> 0x20);
        uStack_652 = (undefined2)((ulong)uVar4 >> 0x30);
        auVar29._2_2_ = local_658;
        auVar29._0_2_ = (short)uVar2;
        auVar29._4_2_ = uStack_646;
        auVar29._6_2_ = uStack_656;
        uStack_b60._0_4_ = CONCAT22(uStack_654,uStack_644);
        uStack_b60._0_6_ = CONCAT24(uStack_642,(undefined4)uStack_b60);
        uStack_b60 = CONCAT26(uStack_652,(undefined6)uStack_b60);
        s32_8x16b[0]._0_2_ = (undefined2)uVar3;
        s32_8x16b[0]._2_2_ = (undefined2)((ulong)uVar3 >> 0x10);
        s32_8x16b[0]._4_2_ = (undefined2)((ulong)uVar3 >> 0x20);
        s32_8x16b[0]._6_2_ = (undefined2)((ulong)uVar3 >> 0x30);
        s33_8x16b[0]._0_2_ = (undefined2)uVar5;
        s33_8x16b[0]._2_2_ = (undefined2)((ulong)uVar5 >> 0x10);
        s33_8x16b[0]._4_2_ = (undefined2)((ulong)uVar5 >> 0x20);
        s33_8x16b[0]._6_2_ = (undefined2)((ulong)uVar5 >> 0x30);
        uStack_666 = (undefined2)((ulong)uVar6 >> 0x10);
        uStack_664 = (undefined2)((ulong)uVar6 >> 0x20);
        uStack_662 = (undefined2)((ulong)uVar6 >> 0x30);
        local_678 = (undefined2)uVar8;
        uStack_676 = (undefined2)((ulong)uVar8 >> 0x10);
        uStack_674 = (undefined2)((ulong)uVar8 >> 0x20);
        uStack_672 = (undefined2)((ulong)uVar8 >> 0x30);
        auVar25._2_2_ = local_678;
        auVar25._0_2_ = (short)uVar6;
        auVar25._4_2_ = uStack_666;
        auVar25._6_2_ = uStack_676;
        uStack_b70._0_4_ = CONCAT22(uStack_674,uStack_664);
        uStack_b70._0_6_ = CONCAT24(uStack_662,(undefined4)uStack_b70);
        uStack_b70 = CONCAT26(uStack_672,(undefined6)uStack_b70);
        s34_8x16b[0]._0_2_ = (undefined2)uVar7;
        s34_8x16b[0]._2_2_ = (undefined2)((ulong)uVar7 >> 0x10);
        s34_8x16b[0]._4_2_ = (undefined2)((ulong)uVar7 >> 0x20);
        s34_8x16b[0]._6_2_ = (undefined2)((ulong)uVar7 >> 0x30);
        s35_8x16b[0]._0_2_ = (undefined2)uVar9;
        s35_8x16b[0]._4_2_ = (undefined2)((ulong)uVar9 >> 0x20);
        uStack_cb6 = (undefined1)uVar9;
        uStack_cb5 = (undefined1)((ulong)uVar9 >> 8);
        uStack_cb4 = (undefined1)((ulong)uVar7 >> 0x10);
        uStack_cb3 = (undefined1)((ulong)uVar7 >> 0x18);
        uStack_cb2 = (undefined1)((ulong)uVar9 >> 0x10);
        uVar37 = uStack_cb2;
        uStack_cb1 = (undefined1)((ulong)uVar9 >> 0x18);
        uVar38 = uStack_cb1;
        uStack_cae = (undefined1)((ulong)uVar9 >> 0x20);
        uStack_cad = (undefined1)((ulong)uVar9 >> 0x28);
        uStack_cac = (undefined1)((ulong)uVar7 >> 0x30);
        uStack_cab = (undefined1)((ulong)uVar7 >> 0x38);
        uStack_caa = (undefined1)((ulong)uVar9 >> 0x30);
        uVar39 = uStack_caa;
        uStack_ca9 = (undefined1)((ulong)uVar9 >> 0x38);
        uVar40 = uStack_ca9;
        auVar28._4_4_ = uVar36;
        auVar28._0_4_ = uVar36;
        auVar28._12_4_ = uVar36;
        auVar28._8_4_ = uVar36;
        auVar29._8_8_ = uStack_b60;
        auVar44 = pmaddwd(auVar29,auVar28);
        auVar27._2_2_ = (undefined2)s33_8x16b[0];
        auVar27._0_2_ = (undefined2)s32_8x16b[0];
        auVar27._4_2_ = s32_8x16b[0]._2_2_;
        auVar27._6_2_ = s33_8x16b[0]._2_2_;
        auVar27._10_2_ = s33_8x16b[0]._4_2_;
        auVar27._8_2_ = s32_8x16b[0]._4_2_;
        auVar27._12_2_ = s32_8x16b[0]._6_2_;
        auVar27._14_2_ = s33_8x16b[0]._6_2_;
        auVar26._4_4_ = uVar36;
        auVar26._0_4_ = uVar36;
        auVar26._12_4_ = uVar36;
        auVar26._8_4_ = uVar36;
        auVar45 = pmaddwd(auVar27,auVar26);
        auVar24._4_4_ = uStack_b64;
        auVar24._0_4_ = uStack_b64;
        auVar24._12_4_ = uStack_b64;
        auVar24._8_4_ = uStack_b64;
        auVar25._8_8_ = uStack_b70;
        auVar46 = pmaddwd(auVar25,auVar24);
        auVar23[2] = uStack_cb6;
        auVar23._0_2_ = (undefined2)s34_8x16b[0];
        auVar23[3] = uStack_cb5;
        auVar23[4] = uStack_cb4;
        auVar23[5] = uStack_cb3;
        auVar23[6] = uStack_cb2;
        auVar23[7] = uStack_cb1;
        auVar23[10] = uStack_cae;
        auVar23._8_2_ = s34_8x16b[0]._4_2_;
        auVar23[0xb] = uStack_cad;
        auVar23[0xc] = uStack_cac;
        auVar23[0xd] = uStack_cab;
        auVar23[0xe] = uStack_caa;
        auVar23[0xf] = uStack_ca9;
        auVar22._4_4_ = uStack_b64;
        auVar22._0_4_ = uStack_b64;
        auVar22._12_4_ = uStack_b64;
        auVar22._8_4_ = uStack_b64;
        auVar47 = pmaddwd(auVar23,auVar22);
        local_348 = auVar44._0_4_;
        iStack_344 = auVar44._4_4_;
        iStack_340 = auVar44._8_4_;
        iStack_33c = auVar44._12_4_;
        local_358 = auVar46._0_4_;
        iStack_354 = auVar46._4_4_;
        iStack_350 = auVar46._8_4_;
        iStack_34c = auVar46._12_4_;
        local_368 = auVar45._0_4_;
        iStack_364 = auVar45._4_4_;
        iStack_360 = auVar45._8_4_;
        iStack_35c = auVar45._12_4_;
        local_378 = auVar47._0_4_;
        iStack_374 = auVar47._4_4_;
        iStack_370 = auVar47._8_4_;
        iStack_36c = auVar47._12_4_;
        auVar44 = ZEXT416(6);
        auVar45 = ZEXT416(6);
        iVar42 = (local_348 + local_358 >> auVar44) + 0x20;
        iVar48 = (iStack_344 + iStack_354 >> auVar44) + 0x20;
        iVar49 = (iStack_340 + iStack_350 >> auVar44) + 0x20;
        iVar50 = (iStack_33c + iStack_34c >> auVar44) + 0x20;
        uStack_b84 = (undefined1)iVar48;
        uStack_b83 = (undefined1)((uint)iVar48 >> 8);
        uStack_b82 = (undefined1)((uint)iVar48 >> 0x10);
        uStack_b81 = (undefined1)((uint)iVar48 >> 0x18);
        uStack_b7c = (undefined1)iVar50;
        uStack_b7b = (undefined1)((uint)iVar50 >> 8);
        uStack_b7a = (undefined1)((uint)iVar50 >> 0x10);
        uStack_b79 = (undefined1)((uint)iVar50 >> 0x18);
        iStack_204 = (int)(CONCAT17(uStack_b81,
                                    CONCAT16(uStack_b82,
                                             CONCAT15(uStack_b83,CONCAT14(uStack_b84,iVar42)))) >>
                          0x20);
        iStack_1fc = (int)(CONCAT17(uStack_b79,
                                    CONCAT16(uStack_b7a,
                                             CONCAT15(uStack_b7b,CONCAT14(uStack_b7c,iVar49)))) >>
                          0x20);
        auVar44 = ZEXT416(6);
        auVar35._4_4_ = iStack_204 >> auVar44;
        auVar35._0_4_ = iVar42 >> auVar44;
        auVar35._12_4_ = iStack_1fc >> auVar44;
        auVar35._8_4_ = iVar49 >> auVar44;
        auVar44 = packssdw(auVar35,ZEXT816(0));
        iVar42 = (local_368 + local_378 >> auVar45) + 0x20;
        iVar48 = (iStack_364 + iStack_374 >> auVar45) + 0x20;
        iVar49 = (iStack_360 + iStack_370 >> auVar45) + 0x20;
        iVar50 = (iStack_35c + iStack_36c >> auVar45) + 0x20;
        uStack_cb4 = (undefined1)iVar48;
        uStack_cb3 = (undefined1)((uint)iVar48 >> 8);
        uStack_cb2 = (undefined1)((uint)iVar48 >> 0x10);
        uStack_cb1 = (undefined1)((uint)iVar48 >> 0x18);
        uStack_cac = (undefined1)iVar50;
        uStack_cab = (undefined1)((uint)iVar50 >> 8);
        uStack_caa = (undefined1)((uint)iVar50 >> 0x10);
        uStack_ca9 = (undefined1)((uint)iVar50 >> 0x18);
        iStack_224 = (int)(CONCAT17(uStack_cb1,
                                    CONCAT16(uStack_cb2,
                                             CONCAT15(uStack_cb3,CONCAT14(uStack_cb4,iVar42)))) >>
                          0x20);
        iStack_21c = (int)(CONCAT17(uStack_ca9,
                                    CONCAT16(uStack_caa,
                                             CONCAT15(uStack_cab,CONCAT14(uStack_cac,iVar49)))) >>
                          0x20);
        auVar45 = ZEXT416(6);
        local_cc8 = CONCAT44(iStack_224 >> auVar45,iVar42 >> auVar45);
        uStack_cc0._0_4_ = iVar49 >> auVar45;
        uStack_cc0._4_4_ = iStack_21c >> auVar45;
        auVar34._8_8_ = uStack_cc0;
        auVar34._0_8_ = local_cc8;
        auVar45 = packssdw(auVar34,ZEXT816(0));
        local_898 = auVar44._0_2_;
        sStack_896 = auVar44._2_2_;
        sStack_894 = auVar44._4_2_;
        sStack_892 = auVar44._6_2_;
        local_8b8 = auVar45._0_2_;
        sStack_8b6 = auVar45._2_2_;
        sStack_8b4 = auVar45._4_2_;
        sStack_8b2 = auVar45._6_2_;
        *local_af8 = CONCAT17((0 < sStack_8b2) * (sStack_8b2 < 0x100) * auVar45[6] -
                              (0xff < sStack_8b2),
                              CONCAT16((0 < sStack_8b4) * (sStack_8b4 < 0x100) * auVar45[4] -
                                       (0xff < sStack_8b4),
                                       CONCAT15((0 < sStack_8b6) * (sStack_8b6 < 0x100) * auVar45[2]
                                                - (0xff < sStack_8b6),
                                                CONCAT14((0 < local_8b8) * (local_8b8 < 0x100) *
                                                         auVar45[0] - (0xff < local_8b8),
                                                         CONCAT13((0 < sStack_892) *
                                                                  (sStack_892 < 0x100) * auVar44[6]
                                                                  - (0xff < sStack_892),
                                                                  CONCAT12((0 < sStack_894) *
                                                                           (sStack_894 < 0x100) *
                                                                           auVar44[4] -
                                                                           (0xff < sStack_894),
                                                                           CONCAT11((0 < sStack_896)
                                                                                    * (sStack_896 <
                                                                                      0x100) *
                                                                                    auVar44[2] -
                                                                                    (0xff < 
                                                  sStack_896),
                                                  (0 < local_898) * (local_898 < 0x100) * auVar44[0]
                                                  - (0xff < local_898))))))));
        puVar1 = (undefined8 *)((long)local_af0 + (long)(in_EDX * 3) * 2);
        uVar2 = *puVar1;
        uVar3 = puVar1[1];
        auVar21._2_2_ = (short)uVar6;
        auVar21._0_2_ = local_658;
        auVar21._4_2_ = uStack_656;
        auVar21._6_2_ = uStack_666;
        uStack_b60._0_4_ = CONCAT22(uStack_664,uStack_654);
        uStack_b60._0_6_ = CONCAT24(uStack_652,(undefined4)uStack_b60);
        uStack_b60 = CONCAT26(uStack_662,(undefined6)uStack_b60);
        auVar20._4_4_ = uVar36;
        auVar20._0_4_ = uVar36;
        auVar20._12_4_ = uVar36;
        auVar20._8_4_ = uVar36;
        auVar21._8_8_ = uStack_b60;
        auVar44 = pmaddwd(auVar21,auVar20);
        auVar19._2_2_ = (undefined2)s34_8x16b[0];
        auVar19._0_2_ = (undefined2)s33_8x16b[0];
        auVar19._4_2_ = s33_8x16b[0]._2_2_;
        auVar19._6_2_ = s34_8x16b[0]._2_2_;
        auVar19._10_2_ = s34_8x16b[0]._4_2_;
        auVar19._8_2_ = s33_8x16b[0]._4_2_;
        auVar19._12_2_ = s33_8x16b[0]._6_2_;
        auVar19._14_2_ = s34_8x16b[0]._6_2_;
        auVar18._4_4_ = uVar36;
        auVar18._0_4_ = uVar36;
        auVar18._12_4_ = uVar36;
        auVar18._8_4_ = uVar36;
        auVar45 = pmaddwd(auVar19,auVar18);
        local_6b8 = (undefined2)uVar2;
        uStack_6b6 = (undefined2)((ulong)uVar2 >> 0x10);
        uStack_6b4 = (undefined2)((ulong)uVar2 >> 0x20);
        uStack_6b2 = (undefined2)((ulong)uVar2 >> 0x30);
        auVar17._2_2_ = local_6b8;
        auVar17._0_2_ = local_678;
        auVar17._4_2_ = uStack_676;
        auVar17._6_2_ = uStack_6b6;
        uStack_b70._0_4_ = CONCAT22(uStack_6b4,uStack_674);
        uStack_b70._0_6_ = CONCAT24(uStack_672,(undefined4)uStack_b70);
        uStack_b70 = CONCAT26(uStack_6b2,(undefined6)uStack_b70);
        uStack_cb6 = (undefined1)uVar3;
        uStack_cb5 = (undefined1)((ulong)uVar3 >> 8);
        uStack_cb2 = (undefined1)((ulong)uVar3 >> 0x10);
        uStack_cb1 = (undefined1)((ulong)uVar3 >> 0x18);
        uStack_cae = (undefined1)((ulong)uVar3 >> 0x20);
        uStack_cad = (undefined1)((ulong)uVar3 >> 0x28);
        uStack_caa = (undefined1)((ulong)uVar3 >> 0x30);
        uStack_ca9 = (undefined1)((ulong)uVar3 >> 0x38);
        auVar16._4_4_ = uStack_b64;
        auVar16._0_4_ = uStack_b64;
        auVar16._12_4_ = uStack_b64;
        auVar16._8_4_ = uStack_b64;
        auVar17._8_8_ = uStack_b70;
        auVar46 = pmaddwd(auVar17,auVar16);
        auVar15[2] = uStack_cb6;
        auVar15._0_2_ = (undefined2)s35_8x16b[0];
        auVar15[3] = uStack_cb5;
        auVar15[4] = uVar37;
        auVar15[5] = uVar38;
        auVar15[6] = uStack_cb2;
        auVar15[7] = uStack_cb1;
        auVar15[10] = uStack_cae;
        auVar15._8_2_ = s35_8x16b[0]._4_2_;
        auVar15[0xb] = uStack_cad;
        auVar15[0xc] = uVar39;
        auVar15[0xd] = uVar40;
        auVar15[0xe] = uStack_caa;
        auVar15[0xf] = uStack_ca9;
        auVar14._4_4_ = uStack_b64;
        auVar14._0_4_ = uStack_b64;
        auVar14._12_4_ = uStack_b64;
        auVar14._8_4_ = uStack_b64;
        auVar47 = pmaddwd(auVar15,auVar14);
        local_3c8 = auVar44._0_4_;
        iStack_3c4 = auVar44._4_4_;
        iStack_3c0 = auVar44._8_4_;
        iStack_3bc = auVar44._12_4_;
        local_3d8 = auVar46._0_4_;
        iStack_3d4 = auVar46._4_4_;
        iStack_3d0 = auVar46._8_4_;
        iStack_3cc = auVar46._12_4_;
        local_3e8 = auVar45._0_4_;
        iStack_3e4 = auVar45._4_4_;
        iStack_3e0 = auVar45._8_4_;
        iStack_3dc = auVar45._12_4_;
        local_3f8 = auVar47._0_4_;
        iStack_3f4 = auVar47._4_4_;
        iStack_3f0 = auVar47._8_4_;
        iStack_3ec = auVar47._12_4_;
        auVar44 = ZEXT416(6);
        auVar45 = ZEXT416(6);
        iVar42 = (local_3c8 + local_3d8 >> auVar44) + 0x20;
        iVar48 = (iStack_3c4 + iStack_3d4 >> auVar44) + 0x20;
        iVar49 = (iStack_3c0 + iStack_3d0 >> auVar44) + 0x20;
        iVar50 = (iStack_3bc + iStack_3cc >> auVar44) + 0x20;
        uStack_b84 = (undefined1)iVar48;
        uStack_b83 = (undefined1)((uint)iVar48 >> 8);
        uStack_b82 = (undefined1)((uint)iVar48 >> 0x10);
        uStack_b81 = (undefined1)((uint)iVar48 >> 0x18);
        uStack_b7c = (undefined1)iVar50;
        uStack_b7b = (undefined1)((uint)iVar50 >> 8);
        uStack_b7a = (undefined1)((uint)iVar50 >> 0x10);
        uStack_b79 = (undefined1)((uint)iVar50 >> 0x18);
        iStack_284 = (int)(CONCAT17(uStack_b81,
                                    CONCAT16(uStack_b82,
                                             CONCAT15(uStack_b83,CONCAT14(uStack_b84,iVar42)))) >>
                          0x20);
        iStack_27c = (int)(CONCAT17(uStack_b79,
                                    CONCAT16(uStack_b7a,
                                             CONCAT15(uStack_b7b,CONCAT14(uStack_b7c,iVar49)))) >>
                          0x20);
        auVar44 = ZEXT416(6);
        auVar33._4_4_ = iStack_284 >> auVar44;
        auVar33._0_4_ = iVar42 >> auVar44;
        auVar33._12_4_ = iStack_27c >> auVar44;
        auVar33._8_4_ = iVar49 >> auVar44;
        auVar44 = packssdw(auVar33,ZEXT816(0));
        iVar42 = (local_3e8 + local_3f8 >> auVar45) + 0x20;
        iVar48 = (iStack_3e4 + iStack_3f4 >> auVar45) + 0x20;
        iVar49 = (iStack_3e0 + iStack_3f0 >> auVar45) + 0x20;
        iVar50 = (iStack_3dc + iStack_3ec >> auVar45) + 0x20;
        uStack_cb4 = (undefined1)iVar48;
        uStack_cb3 = (undefined1)((uint)iVar48 >> 8);
        uStack_cb2 = (undefined1)((uint)iVar48 >> 0x10);
        uStack_cb1 = (undefined1)((uint)iVar48 >> 0x18);
        uStack_cac = (undefined1)iVar50;
        uStack_cab = (undefined1)((uint)iVar50 >> 8);
        uStack_caa = (undefined1)((uint)iVar50 >> 0x10);
        uStack_ca9 = (undefined1)((uint)iVar50 >> 0x18);
        iStack_2a4 = (int)(CONCAT17(uStack_cb1,
                                    CONCAT16(uStack_cb2,
                                             CONCAT15(uStack_cb3,CONCAT14(uStack_cb4,iVar42)))) >>
                          0x20);
        iStack_29c = (int)(CONCAT17(uStack_ca9,
                                    CONCAT16(uStack_caa,
                                             CONCAT15(uStack_cab,CONCAT14(uStack_cac,iVar49)))) >>
                          0x20);
        auVar45 = ZEXT416(6);
        local_cc8 = CONCAT44(iStack_2a4 >> auVar45,iVar42 >> auVar45);
        uStack_cc0._0_4_ = iVar49 >> auVar45;
        uStack_cc0._4_4_ = iStack_29c >> auVar45;
        auVar32._8_8_ = uStack_cc0;
        auVar32._0_8_ = local_cc8;
        auVar45 = packssdw(auVar32,ZEXT816(0));
        local_8d8 = auVar44._0_2_;
        sStack_8d6 = auVar44._2_2_;
        sStack_8d4 = auVar44._4_2_;
        sStack_8d2 = auVar44._6_2_;
        local_8f8 = auVar45._0_2_;
        sStack_8f6 = auVar45._2_2_;
        sStack_8f4 = auVar45._4_2_;
        sStack_8f2 = auVar45._6_2_;
        *(ulong *)((long)local_af8 + (long)in_ECX) =
             CONCAT17((0 < sStack_8f2) * (sStack_8f2 < 0x100) * auVar45[6] - (0xff < sStack_8f2),
                      CONCAT16((0 < sStack_8f4) * (sStack_8f4 < 0x100) * auVar45[4] -
                               (0xff < sStack_8f4),
                               CONCAT15((0 < sStack_8f6) * (sStack_8f6 < 0x100) * auVar45[2] -
                                        (0xff < sStack_8f6),
                                        CONCAT14((0 < local_8f8) * (local_8f8 < 0x100) * auVar45[0]
                                                 - (0xff < local_8f8),
                                                 CONCAT13((0 < sStack_8d2) * (sStack_8d2 < 0x100) *
                                                          auVar44[6] - (0xff < sStack_8d2),
                                                          CONCAT12((0 < sStack_8d4) *
                                                                   (sStack_8d4 < 0x100) * auVar44[4]
                                                                   - (0xff < sStack_8d4),
                                                                   CONCAT11((0 < sStack_8d6) *
                                                                            (sStack_8d6 < 0x100) *
                                                                            auVar44[2] -
                                                                            (0xff < sStack_8d6),
                                                                            (0 < local_8d8) *
                                                                            (local_8d8 < 0x100) *
                                                                            auVar44[0] -
                                                                            (0xff < local_8d8)))))))
                     );
        local_af0 = (undefined8 *)((long)local_af0 + (long)(in_EDX << 1) * 2);
        local_af8 = (ulong *)((long)local_af8 + (long)(in_ECX << 1));
      }
    }
  }
  else {
    local_af8 = in_RSI;
    local_af0 = in_RDI;
    for (local_b10 = 0; puVar1 = local_af0, puVar41 = local_af8, local_b10 < in_R9D;
        local_b10 = local_b10 + 2) {
      for (local_b14 = 0;
          SBORROW4(local_b14,(int)s22_8x16b[1] * 2) != local_b14 + (int)s22_8x16b[1] * -2 < 0;
          local_b14 = local_b14 + 4) {
        uVar2 = *(undefined8 *)((long)local_af0 + (long)-in_EDX * 2);
        uVar3 = *local_af0;
        uStack_6c6 = (undefined2)((ulong)uVar2 >> 0x10);
        uStack_6c4 = (undefined2)((ulong)uVar2 >> 0x20);
        uStack_6c2 = (undefined2)((ulong)uVar2 >> 0x30);
        local_6d8 = (undefined2)uVar3;
        uStack_6d6 = (undefined2)((ulong)uVar3 >> 0x10);
        uStack_6d4 = (undefined2)((ulong)uVar3 >> 0x20);
        uStack_6d2 = (undefined2)((ulong)uVar3 >> 0x30);
        auVar13._2_2_ = local_6d8;
        auVar13._0_2_ = (short)uVar2;
        auVar13._4_2_ = uStack_6c6;
        auVar13._6_2_ = uStack_6d6;
        uStack_b60._0_4_ = CONCAT22(uStack_6d4,uStack_6c4);
        uStack_b60._0_6_ = CONCAT24(uStack_6c2,(undefined4)uStack_b60);
        uStack_b60 = CONCAT26(uStack_6d2,(undefined6)uStack_b60);
        auVar12._4_4_ = uVar36;
        auVar12._0_4_ = uVar36;
        auVar12._12_4_ = uVar36;
        auVar12._8_4_ = uVar36;
        auVar13._8_8_ = uStack_b60;
        auVar44 = pmaddwd(auVar13,auVar12);
        uVar2 = *(undefined8 *)((long)local_af0 + (long)in_EDX * 2);
        uVar3 = *(undefined8 *)((long)local_af0 + (long)(in_EDX * 2) * 2);
        uStack_6e6 = (undefined2)((ulong)uVar2 >> 0x10);
        uStack_6e4 = (undefined2)((ulong)uVar2 >> 0x20);
        uStack_6e2 = (undefined2)((ulong)uVar2 >> 0x30);
        local_6f8 = (undefined2)uVar3;
        uStack_6f6 = (undefined2)((ulong)uVar3 >> 0x10);
        uStack_6f4 = (undefined2)((ulong)uVar3 >> 0x20);
        uStack_6f2 = (undefined2)((ulong)uVar3 >> 0x30);
        auVar11._2_2_ = local_6f8;
        auVar11._0_2_ = (short)uVar2;
        auVar11._4_2_ = uStack_6e6;
        auVar11._6_2_ = uStack_6f6;
        uStack_b70._0_4_ = CONCAT22(uStack_6f4,uStack_6e4);
        uStack_b70._0_6_ = CONCAT24(uStack_6e2,(undefined4)uStack_b70);
        uStack_b70 = CONCAT26(uStack_6f2,(undefined6)uStack_b70);
        auVar10._4_4_ = uStack_b64;
        auVar10._0_4_ = uStack_b64;
        auVar10._12_4_ = uStack_b64;
        auVar10._8_4_ = uStack_b64;
        auVar11._8_8_ = uStack_b70;
        auVar45 = pmaddwd(auVar11,auVar10);
        local_448 = auVar44._0_4_;
        iStack_444 = auVar44._4_4_;
        iStack_440 = auVar44._8_4_;
        iStack_43c = auVar44._12_4_;
        local_458 = auVar45._0_4_;
        iStack_454 = auVar45._4_4_;
        iStack_450 = auVar45._8_4_;
        iStack_44c = auVar45._12_4_;
        auVar44 = ZEXT416(6);
        iVar42 = (local_448 + local_458 >> auVar44) + 0x20;
        iVar48 = (iStack_444 + iStack_454 >> auVar44) + 0x20;
        iVar49 = (iStack_440 + iStack_450 >> auVar44) + 0x20;
        iVar50 = (iStack_43c + iStack_44c >> auVar44) + 0x20;
        uStack_b84 = (undefined1)iVar48;
        uStack_b83 = (undefined1)((uint)iVar48 >> 8);
        uStack_b82 = (undefined1)((uint)iVar48 >> 0x10);
        uStack_b81 = (undefined1)((uint)iVar48 >> 0x18);
        uStack_b7c = (undefined1)iVar50;
        uStack_b7b = (undefined1)((uint)iVar50 >> 8);
        uStack_b7a = (undefined1)((uint)iVar50 >> 0x10);
        uStack_b79 = (undefined1)((uint)iVar50 >> 0x18);
        iStack_2e4 = (int)(CONCAT17(uStack_b81,
                                    CONCAT16(uStack_b82,
                                             CONCAT15(uStack_b83,CONCAT14(uStack_b84,iVar42)))) >>
                          0x20);
        iStack_2dc = (int)(CONCAT17(uStack_b79,
                                    CONCAT16(uStack_b7a,
                                             CONCAT15(uStack_b7b,CONCAT14(uStack_b7c,iVar49)))) >>
                          0x20);
        auVar44 = ZEXT416(6);
        auVar31._4_4_ = iStack_2e4 >> auVar44;
        auVar31._0_4_ = iVar42 >> auVar44;
        auVar31._12_4_ = iStack_2dc >> auVar44;
        auVar31._8_4_ = iVar49 >> auVar44;
        auVar44 = packssdw(auVar31,ZEXT816(0));
        local_918 = auVar44._0_2_;
        sStack_916 = auVar44._2_2_;
        sStack_914 = auVar44._4_2_;
        sStack_912 = auVar44._6_2_;
        *local_af8 = *local_af8 & 0xffffffff00000000 |
                     (ulong)CONCAT13((0 < sStack_912) * (sStack_912 < 0x100) * auVar44[6] -
                                     (0xff < sStack_912),
                                     CONCAT12((0 < sStack_914) * (sStack_914 < 0x100) * auVar44[4] -
                                              (0xff < sStack_914),
                                              CONCAT11((0 < sStack_916) * (sStack_916 < 0x100) *
                                                       auVar44[2] - (0xff < sStack_916),
                                                       (0 < local_918) * (local_918 < 0x100) *
                                                       auVar44[0] - (0xff < local_918))));
        uVar3 = *(undefined8 *)((long)local_af0 + (long)(in_EDX * 3) * 2);
        auVar47._2_2_ = (short)uVar2;
        auVar47._0_2_ = local_6d8;
        auVar47._4_2_ = uStack_6d6;
        auVar47._6_2_ = uStack_6e6;
        uStack_b60._0_4_ = CONCAT22(uStack_6e4,uStack_6d4);
        uStack_b60._0_6_ = CONCAT24(uStack_6d2,(undefined4)uStack_b60);
        uStack_b60 = CONCAT26(uStack_6e2,(undefined6)uStack_b60);
        auVar46._4_4_ = uVar36;
        auVar46._0_4_ = uVar36;
        auVar46._12_4_ = uVar36;
        auVar46._8_4_ = uVar36;
        auVar47._8_8_ = uStack_b60;
        auVar46 = pmaddwd(auVar47,auVar46);
        local_738 = (undefined2)uVar3;
        uStack_736 = (undefined2)((ulong)uVar3 >> 0x10);
        uStack_734 = (undefined2)((ulong)uVar3 >> 0x20);
        uStack_732 = (undefined2)((ulong)uVar3 >> 0x30);
        auVar45._2_2_ = local_738;
        auVar45._0_2_ = local_6f8;
        auVar45._4_2_ = uStack_6f6;
        auVar45._6_2_ = uStack_736;
        uStack_b70._0_4_ = CONCAT22(uStack_734,uStack_6f4);
        uStack_b70._0_6_ = CONCAT24(uStack_6f2,(undefined4)uStack_b70);
        uStack_b70 = CONCAT26(uStack_732,(undefined6)uStack_b70);
        auVar44._4_4_ = uStack_b64;
        auVar44._0_4_ = uStack_b64;
        auVar44._12_4_ = uStack_b64;
        auVar44._8_4_ = uStack_b64;
        auVar45._8_8_ = uStack_b70;
        auVar44 = pmaddwd(auVar45,auVar44);
        local_488 = auVar46._0_4_;
        iStack_484 = auVar46._4_4_;
        iStack_480 = auVar46._8_4_;
        iStack_47c = auVar46._12_4_;
        local_498 = auVar44._0_4_;
        iStack_494 = auVar44._4_4_;
        iStack_490 = auVar44._8_4_;
        iStack_48c = auVar44._12_4_;
        auVar44 = ZEXT416(6);
        iVar42 = (local_488 + local_498 >> auVar44) + 0x20;
        iVar48 = (iStack_484 + iStack_494 >> auVar44) + 0x20;
        iVar49 = (iStack_480 + iStack_490 >> auVar44) + 0x20;
        iVar50 = (iStack_47c + iStack_48c >> auVar44) + 0x20;
        uStack_b84 = (undefined1)iVar48;
        uStack_b83 = (undefined1)((uint)iVar48 >> 8);
        uStack_b82 = (undefined1)((uint)iVar48 >> 0x10);
        uStack_b81 = (undefined1)((uint)iVar48 >> 0x18);
        uStack_b7c = (undefined1)iVar50;
        uStack_b7b = (undefined1)((uint)iVar50 >> 8);
        uStack_b7a = (undefined1)((uint)iVar50 >> 0x10);
        uStack_b79 = (undefined1)((uint)iVar50 >> 0x18);
        iStack_324 = (int)(CONCAT17(uStack_b81,
                                    CONCAT16(uStack_b82,
                                             CONCAT15(uStack_b83,CONCAT14(uStack_b84,iVar42)))) >>
                          0x20);
        iStack_31c = (int)(CONCAT17(uStack_b79,
                                    CONCAT16(uStack_b7a,
                                             CONCAT15(uStack_b7b,CONCAT14(uStack_b7c,iVar49)))) >>
                          0x20);
        auVar44 = ZEXT416(6);
        auVar30._4_4_ = iStack_324 >> auVar44;
        auVar30._0_4_ = iVar42 >> auVar44;
        auVar30._12_4_ = iStack_31c >> auVar44;
        auVar30._8_4_ = iVar49 >> auVar44;
        auVar44 = packssdw(auVar30,ZEXT816(0));
        local_938 = auVar44._0_2_;
        sStack_936 = auVar44._2_2_;
        sStack_934 = auVar44._4_2_;
        sStack_932 = auVar44._6_2_;
        uVar43 = *(ulong *)((long)local_af8 + (long)in_ECX) & 0xffffffff00000000;
        uStack_7f4 = (undefined1)(uVar43 >> 0x20);
        uStack_7f3 = (undefined1)(uVar43 >> 0x28);
        uStack_7f2 = (undefined1)(uVar43 >> 0x30);
        uStack_7f1 = (undefined1)(uVar43 >> 0x38);
        local_ba8 = CONCAT17(uStack_7f1,
                             CONCAT16(uStack_7f2,
                                      CONCAT15(uStack_7f3,
                                               CONCAT14(uStack_7f4,
                                                        CONCAT13((0 < sStack_932) *
                                                                 (sStack_932 < 0x100) * auVar44[6] -
                                                                 (0xff < sStack_932),
                                                                 CONCAT12((0 < sStack_934) *
                                                                          (sStack_934 < 0x100) *
                                                                          auVar44[4] -
                                                                          (0xff < sStack_934),
                                                                          CONCAT11((0 < sStack_936)
                                                                                   * (sStack_936 <
                                                                                     0x100) *
                                                                                   auVar44[2] -
                                                                                   (0xff < 
                                                  sStack_936),
                                                  (0 < local_938) * (local_938 < 0x100) * auVar44[0]
                                                  - (0xff < local_938))))))));
        *(undefined8 *)((long)local_af8 + (long)in_ECX) = local_ba8;
        local_af0 = local_af0 + 1;
        local_af8 = (ulong *)((long)local_af8 + 4);
      }
      local_af0 = (undefined8 *)((long)puVar1 + (long)(in_EDX << 1) * 2);
      local_af8 = (ulong *)((long)puVar41 + (long)(in_ECX << 1));
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_vert_w16inp_ssse3(WORD16 *pi2_src,
                                               UWORD8 *pu1_dst,
                                               WORD32 src_strd,
                                               WORD32 dst_strd,
                                               WORD8 *pi1_coeff,
                                               WORD32 ht,
                                               WORD32 wd)
{
    WORD32 row, col;
    WORD16 *pi2_src_copy;
    UWORD8 *pu1_dst_copy;
    __m128i coeff0_1_8x16b, coeff2_3_8x16b;
    __m128i s4_8x16b, s5_8x16b, s6_8x16b, s7_8x16b, s8_8x16b, s9_8x16b;
    __m128i s11_8x16b, s12_8x16b, s15_8x16b, s16_8x16b;
    __m128i zero_8x16b, offset_8x16b, mask_low_32b, mask_high_96b, sign_reg;
    __m128i s21_8x16b, s22_8x16b, s23_8x16b, s24_8x16b, s25_8x16b;
    __m128i s31_8x16b, s32_8x16b, s33_8x16b, s34_8x16b, s35_8x16b;


/* load 8 8-bit coefficients and convert 8-bit into 16-bit  */
    s4_8x16b = _mm_loadl_epi64((__m128i *)pi1_coeff);

    zero_8x16b = _mm_setzero_si128();
    sign_reg =  _mm_cmpgt_epi8(zero_8x16b, s4_8x16b);
    s5_8x16b  = _mm_unpacklo_epi8(s4_8x16b, sign_reg);

    coeff0_1_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(0, 0, 0, 0));  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(1, 1, 1, 1));  /* pi1_coeff[4] */

/*  seting  values in register */
    offset_8x16b = _mm_set1_epi32(OFFSET_14_MINUS_BIT_DEPTH); /* for offset addition */
    mask_low_32b = _mm_set_epi32(0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0x00000000);
    mask_high_96b = _mm_set_epi32(0x00000000, 0x00000000, 0x00000000, 0xFFFFFFFF);

/*  outer for loop starts from here */
    if(wd % 4 == 0)
    { /* wd = multiple of 8 case */

        pi2_src_copy = pi2_src;
        pu1_dst_copy = pu1_dst;

        for(col = 0; col < 2 * wd; col += 8)
        {

            pi2_src = pi2_src_copy + col;
            pu1_dst = pu1_dst_copy + col;


            for(row = 0; row < ht; row += 2)
            {

                /*load 16 pixel values */
                s21_8x16b  = _mm_load_si128((__m128i *)(pi2_src + (-1 * src_strd)));

                /*load 16 pixel values */
                s22_8x16b = _mm_load_si128((__m128i *)(pi2_src + (0 * src_strd)));


                /*load 16 pixel values */
                s23_8x16b = _mm_load_si128((__m128i *)(pi2_src + (1 * src_strd)));

                /*load 16 pixel values */
                s24_8x16b = _mm_load_si128((__m128i *)(pi2_src + (2 * src_strd)));

                s5_8x16b = _mm_unpacklo_epi16(s21_8x16b, s22_8x16b);

                s31_8x16b = _mm_unpackhi_epi16(s21_8x16b, s22_8x16b);

                s6_8x16b = _mm_unpacklo_epi16(s23_8x16b, s24_8x16b);

                s33_8x16b = _mm_unpackhi_epi16(s23_8x16b, s24_8x16b);

                s11_8x16b = _mm_madd_epi16(s5_8x16b, coeff0_1_8x16b);

                s32_8x16b = _mm_madd_epi16(s31_8x16b, coeff0_1_8x16b);

                s12_8x16b = _mm_madd_epi16(s6_8x16b, coeff2_3_8x16b);

                s34_8x16b = _mm_madd_epi16(s33_8x16b, coeff2_3_8x16b);

                s8_8x16b = _mm_add_epi32(s11_8x16b, s12_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */

                s35_8x16b = _mm_add_epi32(s32_8x16b, s34_8x16b);

                /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s6_8x16b = _mm_srai_epi32(s8_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s32_8x16b = _mm_srai_epi32(s35_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);


                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s7_8x16b = _mm_add_epi32(s6_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s8_8x16b = _mm_srai_epi32(s7_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s9_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);

                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s33_8x16b = _mm_add_epi32(s32_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s34_8x16b = _mm_srai_epi32(s33_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s35_8x16b = _mm_packs_epi32(s34_8x16b, zero_8x16b);


                /* i2_tmp = CLIP_U8(i2_tmp);*/
                s7_8x16b = _mm_packus_epi16(s9_8x16b, zero_8x16b);

                s33_8x16b =  _mm_packus_epi16(s35_8x16b, zero_8x16b);

                s7_8x16b = _mm_unpacklo_epi32(s7_8x16b, s33_8x16b);
/* store 8 8-bit output values  */
                /* pu1_dst[col] = (UWORD8)i2_tmp; */
                _mm_storel_epi64((__m128i *)(pu1_dst), s7_8x16b);


                s25_8x16b = _mm_load_si128((__m128i *)(pi2_src + (3 * src_strd)));

                s5_8x16b = _mm_unpacklo_epi16(s22_8x16b, s23_8x16b);

                s31_8x16b = _mm_unpackhi_epi16(s22_8x16b, s23_8x16b);

                s15_8x16b = _mm_madd_epi16(s5_8x16b, coeff0_1_8x16b);

                s32_8x16b = _mm_madd_epi16(s31_8x16b, coeff0_1_8x16b);

                s6_8x16b = _mm_unpacklo_epi16(s24_8x16b, s25_8x16b);

                s33_8x16b = _mm_unpackhi_epi16(s24_8x16b, s25_8x16b);

                s16_8x16b = _mm_madd_epi16(s6_8x16b, coeff2_3_8x16b);

                s34_8x16b = _mm_madd_epi16(s33_8x16b, coeff2_3_8x16b);

                s8_8x16b = _mm_add_epi32(s15_8x16b, s16_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */

                s35_8x16b = _mm_add_epi32(s32_8x16b, s34_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */

                /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s6_8x16b = _mm_srai_epi32(s8_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s32_8x16b = _mm_srai_epi32(s35_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);


                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s7_8x16b = _mm_add_epi32(s6_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s8_8x16b = _mm_srai_epi32(s7_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s9_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);

                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s33_8x16b = _mm_add_epi32(s32_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s34_8x16b = _mm_srai_epi32(s33_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s35_8x16b = _mm_packs_epi32(s34_8x16b, zero_8x16b);


                /* i2_tmp = CLIP_U8(i2_tmp);*/
                s7_8x16b = _mm_packus_epi16(s9_8x16b, zero_8x16b);

                s33_8x16b =  _mm_packus_epi16(s35_8x16b, zero_8x16b);

                s7_8x16b = _mm_unpacklo_epi32(s7_8x16b, s33_8x16b);
/* store 8 8-bit output values  */
                /* pu1_dst[col] = (UWORD8)i2_tmp; */
                _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd), s7_8x16b);

                pi2_src += 2 * src_strd;
                pu1_dst += 2 * dst_strd;


            } /* inner for loop ends here(8-output values in single iteration) */

        }
    }
    else
    { /* wd = multiple of 4 case */

        for(row = 0; row < ht; row += 2)
        {
            pi2_src_copy = pi2_src;
            pu1_dst_copy = pu1_dst;
            for(col = 0; col < 2 * wd; col += 4)
            {

                /*load 8 pixel values  */
                s21_8x16b  = _mm_loadl_epi64((__m128i *)(pi2_src + (-1 * src_strd)));

                /*load 8 pixel values */
                s22_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + (0 * src_strd)));

                s5_8x16b = _mm_unpacklo_epi16(s21_8x16b, s22_8x16b);

                s11_8x16b = _mm_madd_epi16(s5_8x16b, coeff0_1_8x16b);

                /*load 8 pixel values */
                s23_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + (1 * src_strd)));

                /*load 8 pixel values */
                s24_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + (2 * src_strd)));

                s6_8x16b = _mm_unpacklo_epi16(s23_8x16b, s24_8x16b);

                s12_8x16b = _mm_madd_epi16(s6_8x16b, coeff2_3_8x16b);

                s8_8x16b = _mm_add_epi32(s11_8x16b, s12_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */


                /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s6_8x16b = _mm_srai_epi32(s8_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);


                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s7_8x16b = _mm_add_epi32(s6_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s8_8x16b = _mm_srai_epi32(s7_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s9_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);


                /* i2_tmp = CLIP_U8(i2_tmp);*/
                s7_8x16b = _mm_packus_epi16(s9_8x16b, zero_8x16b);

                s9_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst));
                s5_8x16b =  _mm_and_si128(s9_8x16b, mask_low_32b);
                s6_8x16b =  _mm_and_si128(s7_8x16b, mask_high_96b);
                s9_8x16b = _mm_or_si128(s5_8x16b, s6_8x16b);

/* store 8 8-bit output values  */
                /* pu1_dst[col] = (UWORD8)i2_tmp; */
                _mm_storel_epi64((__m128i *)(pu1_dst), s9_8x16b);

                s25_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + (3 * src_strd)));

                s5_8x16b = _mm_unpacklo_epi16(s22_8x16b, s23_8x16b);
                s15_8x16b = _mm_madd_epi16(s5_8x16b, coeff0_1_8x16b);

                s6_8x16b = _mm_unpacklo_epi16(s24_8x16b, s25_8x16b);
                s16_8x16b = _mm_madd_epi16(s6_8x16b, coeff2_3_8x16b);

                s8_8x16b = _mm_add_epi32(s15_8x16b, s16_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */

                /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s6_8x16b = _mm_srai_epi32(s8_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s7_8x16b = _mm_add_epi32(s6_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s8_8x16b = _mm_srai_epi32(s7_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s9_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);

                /* i2_tmp = CLIP_U8(i2_tmp);*/
                s7_8x16b = _mm_packus_epi16(s9_8x16b, zero_8x16b);

                s9_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd));
                s5_8x16b =  _mm_and_si128(s9_8x16b, mask_low_32b);
                s6_8x16b =  _mm_and_si128(s7_8x16b, mask_high_96b);
                s9_8x16b = _mm_or_si128(s5_8x16b, s6_8x16b);

/* store 8 8-bit output values  */
                /* pu1_dst[col] = (UWORD8)i2_tmp; */
                _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd), s9_8x16b);

                pi2_src += 4;   /* To pointer update */
                pu1_dst += 4;
            } /* inner for loop ends here(8-output values in single iteration) */

            pi2_src = pi2_src_copy + 2 * src_strd; /* pointer update */
            pu1_dst = pu1_dst_copy + 2 * dst_strd; /* pointer update */
        }
    }

}